

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O3

void VP8IteratorImport(VP8EncIterator *it,uint8_t *tmp_32)

{
  int iVar1;
  int iVar2;
  WebPPicture *pWVar3;
  long *plVar4;
  uint w;
  uint8_t uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint8_t *puVar13;
  uint8_t *puVar14;
  uint8_t *src;
  uint8_t *src_00;
  uint8_t *src_01;
  ulong uVar15;
  uint w_00;
  uint h;
  ulong uVar16;
  
  iVar1 = it->x_;
  iVar2 = it->y_;
  pWVar3 = it->enc_->pic_;
  src_01 = pWVar3->y + (pWVar3->y_stride * iVar2 + iVar1) * 0x10;
  iVar6 = (pWVar3->uv_stride * iVar2 + iVar1) * 8;
  src = pWVar3->u + iVar6;
  src_00 = pWVar3->v + iVar6;
  uVar11 = pWVar3->width + iVar1 * -0x10;
  uVar9 = 0x10;
  if ((int)uVar11 < 0x10) {
    uVar9 = (ulong)uVar11;
  }
  uVar12 = pWVar3->height + iVar2 * -0x10;
  uVar7 = 0x10;
  if ((int)uVar12 < 0x10) {
    uVar7 = uVar12;
  }
  w = (uint)uVar9;
  w_00 = (int)(w + 1) >> 1;
  h = (int)(uVar7 + 1) >> 1;
  ImportBlock(src_01,pWVar3->y_stride,it->yuv_in_,w,uVar7,0x10);
  ImportBlock(src,pWVar3->uv_stride,it->yuv_in_ + 0x10,w_00,h,8);
  ImportBlock(src_00,pWVar3->uv_stride,it->yuv_in_ + 0x18,w_00,h,8);
  if (tmp_32 == (uint8_t *)0x0) {
    return;
  }
  if (iVar1 == 0) {
    InitLeft(it);
  }
  else {
    if (iVar2 == 0) {
      uVar5 = '\x7f';
      it->v_left_[-1] = '\x7f';
      it->u_left_[-1] = '\x7f';
      lVar10 = 0x168;
    }
    else {
      it->y_left_[-1] = src_01[~(long)pWVar3->y_stride];
      it->u_left_[-1] = src[~(long)pWVar3->uv_stride];
      uVar5 = src_00[~(long)pWVar3->uv_stride];
      lVar10 = 0x178;
    }
    *(uint8_t *)(*(long *)(it->i4_boundary_ + lVar10 + -0x50) + -1) = uVar5;
    puVar14 = it->y_left_;
    if ((int)uVar12 < 1) {
      uVar8 = 0;
LAB_00137584:
      memset(puVar14 + uVar8,(uint)puVar14[(long)(int)uVar7 + -1],0x10 - (ulong)uVar8);
    }
    else {
      iVar1 = pWVar3->y_stride;
      puVar13 = src_01 + -1;
      uVar15 = 0;
      do {
        puVar14[uVar15] = *puVar13;
        uVar15 = uVar15 + 1;
        puVar13 = puVar13 + iVar1;
      } while (uVar7 != uVar15);
      uVar8 = uVar7;
      if ((int)uVar12 < 0x10) goto LAB_00137584;
    }
    plVar4 = (long *)it->u_left_;
    lVar10 = (long)(int)h;
    if ((int)h < 1) {
      *plVar4 = (ulong)*(byte *)((long)plVar4 + lVar10 + -1) * 0x101010101010101;
      puVar14 = it->v_left_;
LAB_00137631:
      h = 0;
    }
    else {
      iVar1 = pWVar3->uv_stride;
      puVar14 = src + -1;
      uVar16 = (ulong)h;
      uVar15 = 0;
      do {
        *(uint8_t *)((long)plVar4 + uVar15) = *puVar14;
        uVar15 = uVar15 + 1;
        puVar14 = puVar14 + iVar1;
      } while (uVar16 != uVar15);
      if ((int)h < 8) {
        memset((void *)((long)plVar4 + uVar16),(uint)*(byte *)((long)plVar4 + (uVar16 - 1)),
               8 - uVar16);
        puVar14 = it->v_left_;
        if ((int)h < 1) goto LAB_00137631;
      }
      else {
        puVar14 = it->v_left_;
      }
      iVar1 = pWVar3->uv_stride;
      puVar13 = src_00 + -1;
      uVar15 = 0;
      do {
        puVar14[uVar15] = *puVar13;
        uVar15 = uVar15 + 1;
        puVar13 = puVar13 + iVar1;
      } while (uVar16 != uVar15);
      if (7 < (int)h) goto LAB_0013767d;
    }
    memset(puVar14 + h,(uint)puVar14[lVar10 + -1],8 - (ulong)h);
  }
LAB_0013767d:
  it->y_top_ = tmp_32;
  it->uv_top_ = tmp_32 + 0x10;
  if (iVar2 == 0) {
    builtin_memcpy(tmp_32,
                   "\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                   ,0x20);
    return;
  }
  if ((int)uVar11 < 1) {
    uVar7 = 0;
LAB_001376ef:
    memset(tmp_32 + uVar7,(uint)tmp_32[(long)(int)w + -1],0x10 - (ulong)uVar7);
  }
  else {
    iVar1 = pWVar3->y_stride;
    uVar15 = 0;
    do {
      tmp_32[uVar15] = src_01[uVar15 - (long)iVar1];
      uVar15 = uVar15 + 1;
    } while (uVar9 != uVar15);
    uVar7 = w;
    if ((int)uVar11 < 0x10) goto LAB_001376ef;
  }
  if ((int)w_00 < 1) {
    *(ulong *)(tmp_32 + 0x10) = (ulong)tmp_32[(long)(int)w_00 + 0xf] * 0x101010101010101;
  }
  else {
    iVar1 = pWVar3->uv_stride;
    uVar16 = (ulong)w_00;
    uVar15 = (ulong)w_00;
    uVar9 = 0;
    do {
      (tmp_32 + 0x10)[uVar9] = src[uVar9 - (long)iVar1];
      uVar9 = uVar9 + 1;
    } while (uVar15 != uVar9);
    if ((7 < (int)w_00) ||
       (memset(tmp_32 + uVar15 + 0x10,(uint)tmp_32[uVar15 + 0xf],8 - uVar15), 0 < (int)w_00)) {
      iVar1 = pWVar3->uv_stride;
      uVar9 = 0;
      do {
        tmp_32[uVar9 + 0x18] = src_00[uVar9 - (long)iVar1];
        uVar9 = uVar9 + 1;
      } while (uVar15 != uVar9);
      if (7 < (int)w_00) {
        return;
      }
      goto LAB_001377b0;
    }
  }
  uVar16 = 0;
LAB_001377b0:
  memset(tmp_32 + uVar16 + 0x18,(uint)tmp_32[(long)(int)w_00 + 0x17],8 - uVar16);
  return;
}

Assistant:

void VP8IteratorImport(VP8EncIterator* const it, uint8_t* const tmp_32) {
  const VP8Encoder* const enc = it->enc_;
  const int x = it->x_, y = it->y_;
  const WebPPicture* const pic = enc->pic_;
  const uint8_t* const ysrc = pic->y + (y * pic->y_stride  + x) * 16;
  const uint8_t* const usrc = pic->u + (y * pic->uv_stride + x) * 8;
  const uint8_t* const vsrc = pic->v + (y * pic->uv_stride + x) * 8;
  const int w = MinSize(pic->width - x * 16, 16);
  const int h = MinSize(pic->height - y * 16, 16);
  const int uv_w = (w + 1) >> 1;
  const int uv_h = (h + 1) >> 1;

  ImportBlock(ysrc, pic->y_stride,  it->yuv_in_ + Y_OFF_ENC, w, h, 16);
  ImportBlock(usrc, pic->uv_stride, it->yuv_in_ + U_OFF_ENC, uv_w, uv_h, 8);
  ImportBlock(vsrc, pic->uv_stride, it->yuv_in_ + V_OFF_ENC, uv_w, uv_h, 8);

  if (tmp_32 == NULL) return;

  // Import source (uncompressed) samples into boundary.
  if (x == 0) {
    InitLeft(it);
  } else {
    if (y == 0) {
      it->y_left_[-1] = it->u_left_[-1] = it->v_left_[-1] = 127;
    } else {
      it->y_left_[-1] = ysrc[- 1 - pic->y_stride];
      it->u_left_[-1] = usrc[- 1 - pic->uv_stride];
      it->v_left_[-1] = vsrc[- 1 - pic->uv_stride];
    }
    ImportLine(ysrc - 1, pic->y_stride,  it->y_left_, h,   16);
    ImportLine(usrc - 1, pic->uv_stride, it->u_left_, uv_h, 8);
    ImportLine(vsrc - 1, pic->uv_stride, it->v_left_, uv_h, 8);
  }

  it->y_top_  = tmp_32 + 0;
  it->uv_top_ = tmp_32 + 16;
  if (y == 0) {
    memset(tmp_32, 127, 32 * sizeof(*tmp_32));
  } else {
    ImportLine(ysrc - pic->y_stride,  1, tmp_32,          w,   16);
    ImportLine(usrc - pic->uv_stride, 1, tmp_32 + 16,     uv_w, 8);
    ImportLine(vsrc - pic->uv_stride, 1, tmp_32 + 16 + 8, uv_w, 8);
  }
}